

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O3

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  size_t len;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  uVar2 = s->_M_string_length;
  if ((3 < uVar2) &&
     ((iVar3 = strcmp(pcVar1 + (uVar2 - 4),"/bin"), iVar3 == 0 ||
      ((uVar2 != 4 && (iVar3 = strcmp(pcVar1 + (uVar2 - 5),"/sbin"), iVar3 == 0)))))) {
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar2);
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if((cmHasLiteralSuffix(s, "/bin")) ||
     (cmHasLiteralSuffix(s, "/sbin")))
    {
    return cmSystemTools::GetFilenamePath(s);
    }
  else
    {
    return s;
    }
}